

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.c
# Opt level: O0

int wally_ec_sig_verify(uchar *pub_key,size_t pub_key_len,uchar *bytes,size_t bytes_len,
                       uint32_t flags,uchar *sig,size_t sig_len)

{
  _Bool _Var1;
  int iVar2;
  secp256k1_context *ctx_00;
  bool bVar3;
  _Bool ok;
  secp256k1_context *ctx;
  secp256k1_ecdsa_signature sig_secp;
  secp256k1_pubkey_conflict pub;
  uchar *sig_local;
  uint32_t flags_local;
  size_t bytes_len_local;
  uchar *bytes_local;
  size_t pub_key_len_local;
  uchar *pub_key_local;
  
  ctx_00 = secp_ctx();
  if (((((pub_key == (uchar *)0x0) || (pub_key_len != 0x21)) || (bytes == (uchar *)0x0)) ||
      ((bytes_len != 0x20 || (_Var1 = is_valid_ec_type(flags), !_Var1)))) ||
     (((flags & 0xfffffffc) != 0 || ((sig == (uchar *)0x0 || (sig_len != 0x40)))))) {
    pub_key_local._4_4_ = -2;
  }
  else if (ctx_00 == (secp256k1_context *)0x0) {
    pub_key_local._4_4_ = -3;
  }
  else {
    iVar2 = pubkey_parse((secp256k1_pubkey_conflict *)(sig_secp.data + 0x38),pub_key,0x21);
    if ((flags & 2) == 0) {
      bVar3 = false;
      if (iVar2 != 0) {
        iVar2 = secp256k1_ecdsa_signature_parse_compact
                          (ctx_00,(secp256k1_ecdsa_signature *)&ctx,sig);
        bVar3 = false;
        if (iVar2 != 0) {
          iVar2 = secp256k1_ecdsa_verify
                            (ctx_00,(secp256k1_ecdsa_signature *)&ctx,bytes,
                             (secp256k1_pubkey_conflict *)(sig_secp.data + 0x38));
          bVar3 = iVar2 != 0;
        }
      }
    }
    else {
      bVar3 = false;
    }
    wally_clear_2(sig_secp.data + 0x38,0x40,&ctx,0x40);
    pub_key_local._4_4_ = -2;
    if (bVar3) {
      pub_key_local._4_4_ = 0;
    }
  }
  return pub_key_local._4_4_;
}

Assistant:

int wally_ec_sig_verify(const unsigned char *pub_key, size_t pub_key_len,
                        const unsigned char *bytes, size_t bytes_len,
                        uint32_t flags,
                        const unsigned char *sig, size_t sig_len)
{
    secp256k1_pubkey pub;
    secp256k1_ecdsa_signature sig_secp;
    const secp256k1_context *ctx = secp_ctx();
    bool ok;

    if (!pub_key || pub_key_len != EC_PUBLIC_KEY_LEN ||
        !bytes || bytes_len != EC_MESSAGE_HASH_LEN ||
        !is_valid_ec_type(flags) || flags & ~EC_FLAGS_TYPES ||
        !sig || sig_len != EC_SIGNATURE_LEN)
        return WALLY_EINVAL;

    if (!ctx)
        return WALLY_ENOMEM;

    ok = pubkey_parse(&pub, pub_key, pub_key_len);

    if (flags & EC_FLAG_SCHNORR)
#if 0 /*FIXME: Schnorr is unavailable in secp for now*/
        ok = ok && secp256k1_schnorr_verify(ctx, sig, bytes, &pub);
#else
        ok = false;
#endif
    else
        ok = ok && secp256k1_ecdsa_signature_parse_compact(ctx, &sig_secp, sig) &&
             secp256k1_ecdsa_verify(ctx, &sig_secp, bytes, &pub);

    wally_clear_2(&pub, sizeof(pub), &sig_secp, sizeof(sig_secp));
    return ok ? WALLY_OK : WALLY_EINVAL;
}